

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int collect_unknown_extension
              (ptls_t *tls,uint16_t type,uint8_t *src,uint8_t *end,ptls_raw_extension_t *slots)

{
  long lVar1;
  long in_RCX;
  void *in_RDX;
  short in_SI;
  long in_R8;
  ptls_iovec_t pVar2;
  size_t i;
  uint8_t *local_48;
  size_t local_40;
  ulong local_38;
  
  local_38 = 0;
  while( true ) {
    if (*(short *)(in_R8 + local_38 * 0x18) == -1) {
      if (local_38 < 0x10) {
        *(short *)(in_R8 + local_38 * 0x18) = in_SI;
        lVar1 = in_R8 + local_38 * 0x18;
        pVar2 = ptls_iovec_init(in_RDX,in_RCX - (long)in_RDX);
        local_48 = pVar2.base;
        *(uint8_t **)(lVar1 + 8) = local_48;
        local_40 = pVar2.len;
        *(size_t *)(lVar1 + 0x10) = local_40;
        *(undefined2 *)(in_R8 + (local_38 + 1) * 0x18) = 0xffff;
      }
      return 0;
    }
    if (0xf < local_38) break;
    if (*(short *)(in_R8 + local_38 * 0x18) == in_SI) {
      return 0x2f;
    }
    local_38 = local_38 + 1;
  }
  __assert_fail("i < MAX_UNKNOWN_EXTENSIONS",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/deps/picotls/lib/picotls.c"
                ,0x97b,
                "int collect_unknown_extension(ptls_t *, uint16_t, const uint8_t *, const uint8_t *const, ptls_raw_extension_t *)"
               );
}

Assistant:

static int collect_unknown_extension(ptls_t *tls, uint16_t type, const uint8_t *src, const uint8_t *const end,
                                     ptls_raw_extension_t *slots)
{
    size_t i;
    for (i = 0; slots[i].type != UINT16_MAX; ++i) {
        assert(i < MAX_UNKNOWN_EXTENSIONS);
        if (slots[i].type == type)
            return PTLS_ALERT_ILLEGAL_PARAMETER;
    }
    if (i < MAX_UNKNOWN_EXTENSIONS) {
        slots[i].type = type;
        slots[i].data = ptls_iovec_init(src, end - src);
        slots[i + 1].type = UINT16_MAX;
    }
    return 0;
}